

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O3

Reg __thiscall backend::codegen::RegAllocator::get_collapse_reg(RegAllocator *this,Reg r)

{
  iterator iVar1;
  Reg local_c;
  
  local_c = r;
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->reg_collapse)._M_h,&local_c);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    local_c = get_collapse_reg(this,*(Reg *)((long)iVar1.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                                  ._M_cur + 0xc));
  }
  return local_c;
}

Assistant:

Reg get_collapse_reg(Reg r) {
    auto rd = reg_collapse.find(r);
    if (rd == reg_collapse.end())
      return r;
    else
      return get_collapse_reg(rd->second);
  }